

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O3

bool __thiscall DistanceGraph::remove_link(DistanceGraph *this,sgNodeID_t source,sgNodeID_t dest)

{
  pointer pvVar1;
  pointer pvVar2;
  sgNodeID_t sVar3;
  sgNodeID_t sVar4;
  undefined4 uVar5;
  SupportType SVar6;
  undefined1 uVar7;
  uint16_t uVar8;
  undefined4 uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  pointer pLVar13;
  pointer pLVar14;
  pointer pLVar15;
  long lVar16;
  bool bVar17;
  
  lVar12 = -source;
  if (0 < source) {
    lVar12 = source;
  }
  pvVar1 = (this->links).
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + lVar12;
  pLVar13 = (pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pLVar15 = *(pointer *)
             ((long)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                     super__Vector_impl_data + 8);
  lVar10 = (long)pLVar15 - (long)pLVar13;
  lVar11 = (lVar10 >> 3) * -0x3333333333333333 >> 2;
  lVar12 = lVar10;
  if (0 < lVar11) {
    lVar12 = lVar11 + 1;
    pLVar14 = pLVar13 + 2;
    do {
      if ((pLVar14[-2].source == source) && (pLVar14[-2].dest == dest)) {
        pLVar14 = pLVar14 + -2;
        goto LAB_001785b7;
      }
      if ((pLVar14[-1].source == source) && (pLVar14[-1].dest == dest)) {
        pLVar14 = pLVar14 + -1;
        goto LAB_001785b7;
      }
      if ((pLVar14->source == source) && (pLVar14->dest == dest)) goto LAB_001785b7;
      if ((pLVar14[1].source == source) && (pLVar14[1].dest == dest)) {
        pLVar14 = pLVar14 + 1;
        goto LAB_001785b7;
      }
      lVar12 = lVar12 + -1;
      pLVar14 = pLVar14 + 4;
    } while (1 < lVar12);
    lVar12 = (long)pLVar15 - (long)(pLVar13 + lVar11 * 4);
    pLVar13 = pLVar13 + lVar11 * 4;
  }
  lVar12 = (lVar12 >> 3) * -0x3333333333333333;
  if (lVar12 == 1) {
LAB_0017858e:
    pLVar14 = pLVar13;
    if (pLVar13->dest != dest || pLVar13->source != source) {
      pLVar14 = pLVar15;
    }
LAB_001785b7:
    pLVar13 = pLVar14 + 1;
    if (pLVar13 != pLVar15 && pLVar14 != pLVar15) {
      do {
        if ((pLVar13->source != source) || (pLVar13->dest != dest)) {
          (pLVar14->support).id = (pLVar13->support).id;
          sVar3 = pLVar13->source;
          sVar4 = pLVar13->dest;
          uVar5 = *(undefined4 *)&pLVar13->field_0x14;
          SVar6 = (pLVar13->support).type;
          uVar7 = (pLVar13->support).field_0x1;
          uVar8 = (pLVar13->support).index;
          uVar9 = *(undefined4 *)&(pLVar13->support).field_0x4;
          pLVar14->dist = pLVar13->dist;
          *(undefined4 *)&pLVar14->field_0x14 = uVar5;
          (pLVar14->support).type = SVar6;
          (pLVar14->support).field_0x1 = uVar7;
          (pLVar14->support).index = uVar8;
          *(undefined4 *)&(pLVar14->support).field_0x4 = uVar9;
          pLVar14->source = sVar3;
          pLVar14->dest = sVar4;
          pLVar14 = pLVar14 + 1;
        }
        pLVar13 = pLVar13 + 1;
      } while (pLVar13 != pLVar15);
      pLVar15 = *(pointer *)
                 ((long)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                         super__Vector_impl_data + 8);
    }
    if (pLVar14 != pLVar15) {
      *(pointer *)
       ((long)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
               super__Vector_impl_data + 8) = pLVar14;
    }
  }
  else {
    if (lVar12 == 2) {
LAB_0017857f:
      if ((pLVar13->source != source) || (pLVar14 = pLVar13, pLVar13->dest != dest)) {
        pLVar13 = pLVar13 + 1;
        goto LAB_0017858e;
      }
      goto LAB_001785b7;
    }
    if (lVar12 == 3) {
      if ((pLVar13->source != source) || (pLVar14 = pLVar13, pLVar13->dest != dest)) {
        pLVar13 = pLVar13 + 1;
        goto LAB_0017857f;
      }
      goto LAB_001785b7;
    }
  }
  lVar12 = -dest;
  if (0 < dest) {
    lVar12 = dest;
  }
  pvVar2 = (this->links).
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + lVar12;
  pLVar13 = (pvVar2->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pLVar15 = *(pointer *)
             ((long)&(pvVar2->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                     super__Vector_impl_data + 8);
  lVar11 = (long)pLVar15 - (long)pLVar13;
  lVar16 = (lVar11 >> 3) * -0x3333333333333333 >> 2;
  lVar12 = lVar11;
  if (0 < lVar16) {
    pLVar14 = pLVar13 + lVar16 * 4;
    lVar16 = lVar16 + 1;
    pLVar13 = pLVar13 + 2;
    do {
      if ((pLVar13[-2].source == dest) && (pLVar13[-2].dest == source)) {
        pLVar13 = pLVar13 + -2;
        goto LAB_00178713;
      }
      if ((pLVar13[-1].source == dest) && (pLVar13[-1].dest == source)) {
        pLVar13 = pLVar13 + -1;
        goto LAB_00178713;
      }
      if ((pLVar13->source == dest) && (pLVar13->dest == source)) goto LAB_00178713;
      if ((pLVar13[1].source == dest) && (pLVar13[1].dest == source)) {
        pLVar13 = pLVar13 + 1;
        goto LAB_00178713;
      }
      lVar16 = lVar16 + -1;
      pLVar13 = pLVar13 + 4;
    } while (1 < lVar16);
    pLVar13 = pLVar14;
    lVar12 = (long)pLVar15 - (long)pLVar14;
  }
  lVar12 = (lVar12 >> 3) * -0x3333333333333333;
  if (lVar12 == 1) {
LAB_001786ea:
    if (pLVar13->dest != source || pLVar13->source != dest) {
      pLVar13 = pLVar15;
    }
  }
  else if (lVar12 == 2) {
LAB_001786db:
    if ((pLVar13->source != dest) || (pLVar13->dest != source)) {
      pLVar13 = pLVar13 + 1;
      goto LAB_001786ea;
    }
  }
  else {
    if (lVar12 != 3) goto LAB_0017876b;
    if ((pLVar13->source != dest) || (pLVar13->dest != source)) {
      pLVar13 = pLVar13 + 1;
      goto LAB_001786db;
    }
  }
LAB_00178713:
  pLVar14 = pLVar13 + 1;
  if (pLVar14 != pLVar15 && pLVar13 != pLVar15) {
    do {
      if ((pLVar14->source != dest) || (pLVar14->dest != source)) {
        (pLVar13->support).id = (pLVar14->support).id;
        sVar3 = pLVar14->source;
        sVar4 = pLVar14->dest;
        uVar5 = *(undefined4 *)&pLVar14->field_0x14;
        SVar6 = (pLVar14->support).type;
        uVar7 = (pLVar14->support).field_0x1;
        uVar8 = (pLVar14->support).index;
        uVar9 = *(undefined4 *)&(pLVar14->support).field_0x4;
        pLVar13->dist = pLVar14->dist;
        *(undefined4 *)&pLVar13->field_0x14 = uVar5;
        (pLVar13->support).type = SVar6;
        (pLVar13->support).field_0x1 = uVar7;
        (pLVar13->support).index = uVar8;
        *(undefined4 *)&(pLVar13->support).field_0x4 = uVar9;
        pLVar13->source = sVar3;
        pLVar13->dest = sVar4;
        pLVar13 = pLVar13 + 1;
      }
      pLVar14 = pLVar14 + 1;
    } while (pLVar14 != pLVar15);
    pLVar15 = *(pointer *)
               ((long)&(pvVar2->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                       super__Vector_impl_data + 8);
  }
  if (pLVar13 != pLVar15) {
    *(pointer *)
     ((long)&(pvVar2->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
             super__Vector_impl_data + 8) = pLVar13;
    pLVar15 = pLVar13;
  }
LAB_0017876b:
  bVar17 = true;
  if ((long)*(pointer *)
             ((long)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                     super__Vector_impl_data + 8) -
      *(long *)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                super__Vector_impl_data == lVar10) {
    bVar17 = (long)pLVar15 -
             *(long *)&(pvVar2->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                       super__Vector_impl_data != lVar11;
  }
  return bVar17;
}

Assistant:

bool DistanceGraph::remove_link(sgNodeID_t source, sgNodeID_t dest) {
    auto & slinks = links[(source > 0 ? source : -source)];
    auto slinksLen = slinks.size();
    slinks.erase(std::remove_if(slinks.begin(), slinks.end(), [source,dest] (auto l) {return l.source==source and l.dest==dest;}), slinks.end());
    auto & dlinks = links[(dest > 0 ? dest : -dest)];
    auto dlinksLen = dlinks.size();
    dlinks.erase(std::remove_if(dlinks.begin(), dlinks.end(), [source,dest] (auto l) {return l.source==dest and l.dest==source;}), dlinks.end());
    if (slinks.size() != slinksLen or dlinks.size() != dlinksLen) return true;
    return false;
}